

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

size_t phosg::parse_size(char *str)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double factor;
  double dVar6;
  
  lVar3 = 0;
  while( true ) {
    uVar1 = (uint)*str;
    if (9 < uVar1 - 0x30) break;
    lVar3 = (ulong)(uVar1 - 0x30) + lVar3 * 10;
    str = (char *)((byte *)str + 1);
  }
  dVar5 = 0.0;
  if (*str == 0x2e) {
    dVar6 = 0.1;
    while( true ) {
      str = (char *)((byte *)str + 1);
      uVar1 = (uint)*str;
      if (9 < uVar1 - 0x30) break;
      dVar5 = dVar5 + (double)(int)(uVar1 - 0x30) * dVar6;
      dVar6 = dVar6 * 0.1;
    }
  }
  while (str = (char *)((byte *)str + 1), (char)uVar1 == ' ') {
    uVar1 = (uint)(byte)*str;
  }
  uVar1 = uVar1 & 0xff;
  switch(uVar1) {
  case 0x45:
switchD_0010a7c3_caseD_65:
    lVar2 = 0x1000000000000000;
    break;
  case 0x47:
switchD_0010a7c3_caseD_67:
    lVar2 = 0x40000000;
    break;
  case 0x4b:
switchD_0010a7c3_caseD_6b:
    lVar2 = 0x400;
    break;
  case 0x4d:
switchD_0010a7c3_caseD_6d:
    lVar2 = 0x100000;
    break;
  case 0x50:
switchD_0010a7c3_caseD_70:
    lVar2 = 0x4000000000000;
    break;
  default:
    switch(uVar1) {
    case 0x65:
      goto switchD_0010a7c3_caseD_65;
    case 0x66:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
      break;
    case 0x67:
      goto switchD_0010a7c3_caseD_67;
    case 0x6b:
      goto switchD_0010a7c3_caseD_6b;
    case 0x6d:
      goto switchD_0010a7c3_caseD_6d;
    case 0x70:
      goto switchD_0010a7c3_caseD_70;
    default:
      if ((uVar1 == 0x54) || (uVar1 == 0x74)) {
        lVar2 = 0x10000000000;
        goto LAB_0010a81b;
      }
    }
  case 0x46:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4c:
  case 0x4e:
  case 0x4f:
    lVar2 = 1;
  }
LAB_0010a81b:
  uVar4 = (ulong)(dVar5 * (double)lVar2);
  return ((long)(dVar5 * (double)lVar2 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4) +
         lVar3 * lVar2;
}

Assistant:

size_t parse_size(const char* str) {
  // input is like [0-9](\.[0-9]+)? *[KkMmGgTtPpEe]?[Bb]?
  // fortunately this can just be parsed left-to-right
  double fractional_part = 0.0;
  size_t integer_part = 0;
  size_t unit_scale = 1;
  for (; isdigit(*str); str++) {
    integer_part = integer_part * 10 + (*str - '0');
  }
  if (*str == '.') {
    str++;
    double factor = 0.1;
    for (; isdigit(*str); str++) {
      fractional_part += factor * (*str - '0');
      factor *= 0.1;
    }
  }
  for (; *str == ' '; str++) {
  }
#if SIZE_T_BITS >= 16
  if (*str == 'K' || *str == 'k') {
    unit_scale = KB_SIZE;
#if SIZE_T_BITS >= 32
  } else if (*str == 'M' || *str == 'm') {
    unit_scale = MB_SIZE;
  } else if (*str == 'G' || *str == 'g') {
    unit_scale = GB_SIZE;
#if SIZE_T_BITS == 64
  } else if (*str == 'T' || *str == 't') {
    unit_scale = TB_SIZE;
  } else if (*str == 'P' || *str == 'p') {
    unit_scale = PB_SIZE;
  } else if (*str == 'E' || *str == 'e') {
    unit_scale = EB_SIZE;
#endif
#endif
  }
#endif

  return integer_part * unit_scale + static_cast<size_t>(fractional_part * unit_scale);
}